

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::NegativeGLSLLinkTime::Run(NegativeGLSLLinkTime *this)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "#version 430 core\nbuffer Buffer { int x; };\nvoid Run();\nvoid main() {\n  Run();\n  x += 2;\n}"
             ,&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "#version 430 core\nbuffer Buffer { uint x; };\nvoid Run() {\n  x += 3;\n}",&local_5a);
  bVar1 = Link(this,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  lVar2 = -1;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "#version 430 core\nbuffer Buffer { int x; int y; };\nvoid Run();\nvoid main() {\n  Run();\n  x += 2;\n}"
               ,&local_59);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "#version 430 core\nbuffer Buffer { int x; };\nvoid Run() {\n  x += 3;\n}",&local_5a)
    ;
    bVar1 = Link(this,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,
                 "#version 430 core\nbuffer Buffer { int y; };\nvoid Run();\nvoid main() {\n  Run();\n  y += 2;\n}"
                 ,&local_59);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,
                 "#version 430 core\nbuffer Buffer { int x; };\nvoid Run() {\n  x += 3;\n}",
                 &local_5a);
      bVar1 = Link(this,&local_38,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,
                   "#version 430 core\nbuffer Buffer { int x; } g_buffer[2];\nvoid Run();\nvoid main() {\n  Run();\n  g_buffer[0].x += 2;\n}"
                   ,&local_59);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,
                   "#version 430 core\nbuffer Buffer { int x; } g_buffer[3];\nvoid Run() {\n  g_buffer[1].x += 3;\n}"
                   ,&local_5a);
        bVar1 = Link(this,&local_38,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_38);
        lVar2 = (ulong)bVar1 - 1;
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		//   declaration of "x" conflicts with previous declaration at 0(4)
		//   declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int x; };" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  x += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { uint x; };" NL "void Run() {" NL "  x += 3;" NL "}"))
			return ERROR;

		//  declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int x; int y; };" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  x += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { int x; };" NL "void Run() {" NL "  x += 3;" NL "}"))
			return ERROR;

		//  declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int y; };" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  y += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { int x; };" NL "void Run() {" NL "  x += 3;" NL "}"))
			return ERROR;

		//  declaration of "g_buffer" conflicts with previous declaration at 0(4)
		//  declaration of "Buffer" conflicts with previous declaration at 0(4)
		if (!Link("#version 430 core" NL "buffer Buffer { int x; } g_buffer[2];" NL "void Run();" NL "void main() {" NL
				  "  Run();" NL "  g_buffer[0].x += 2;" NL "}",
				  "#version 430 core" NL "buffer Buffer { int x; } g_buffer[3];" NL "void Run() {" NL
				  "  g_buffer[1].x += 3;" NL "}"))
			return ERROR;

		return NO_ERROR;
	}